

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O2

void __thiscall asl::WebSocketServer::serve(WebSocketServer *this,Socket *client)

{
  bool bVar1;
  char b;
  int iVar2;
  int iVar3;
  String *pSVar4;
  undefined8 uVar5;
  int k;
  long lVar6;
  Dic<asl::String> headers;
  String name;
  String value;
  String cname;
  String line;
  String head;
  String res;
  String method;
  
  Socket::readLine(&head,client);
  iVar2 = String::indexOf(&head,' ',0);
  if (iVar2 != -1) {
    iVar3 = String::indexOf(&head,' ',iVar2 + 1);
    if (iVar3 != -1) {
      String::substring(&method,&head,0,iVar2);
      String::substring(&res,&head,iVar2 + 1,iVar3);
      line.field_2._space[0] = '\0';
      line._size = 0;
      line._len = 0;
      Array<asl::Map<asl::String,_asl::String>::KeyVal>::Array
                ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)&headers);
      while( true ) {
        Socket::readLine(&name,client);
        String::operator=(&line,&name);
        bVar1 = String::operator!=(&line,"\r");
        String::~String(&name);
        if (!bVar1) break;
        pSVar4 = String::trim(&line);
        String::operator=(&line,pSVar4);
        iVar2 = String::indexOf(&line,':',0);
        if (iVar2 < 0) {
          (*((client->super_SmartObject)._p)->_vptr_SmartObject_[0xb])();
          goto LAB_0012c343;
        }
        String::substring(&name,&line,0,iVar2);
        cname._size = 0;
        cname._len = 0;
        cname.field_2._space[0] = '\0';
        bVar1 = true;
        for (lVar6 = 0; lVar6 < name._len; lVar6 = lVar6 + 1) {
          uVar5 = &name.field_2;
          if (name._size != 0) {
            uVar5 = name.field_2._str;
          }
          if (bVar1) {
            iVar3 = toupper((int)*(char *)(uVar5 + lVar6));
            b = (char)iVar3;
          }
          else {
            iVar3 = tolower((int)*(char *)(uVar5 + lVar6));
            b = (char)iVar3;
          }
          String::operator+=(&cname,b);
          uVar5 = &name.field_2;
          if (name._size != 0) {
            uVar5 = name.field_2._str;
          }
          iVar3 = isalnum((int)*(char *)(uVar5 + lVar6));
          bVar1 = iVar3 == 0;
        }
        if (iVar2 < line._len + -1) {
          String::substring(&value,&line,iVar2 + 2);
        }
        else {
          value.field_2._space[0] = '\0';
          value._size = 0;
          value._len = 0;
        }
        pSVar4 = Map<asl::String,_asl::String>::operator[]
                           (&headers.super_Map<asl::String,_asl::String>,&cname);
        String::operator=(pSVar4,&value);
        String::~String(&value);
        String::~String(&cname);
        String::~String(&name);
      }
      String::String(&cname,"\n");
      String::String(&value,": ");
      Map<asl::String,_asl::String>::join
                (&name,&headers.super_Map<asl::String,_asl::String>,&cname,&value);
      String::~String(&name);
      String::~String(&value);
      String::~String(&cname);
      process(this,client,&headers);
LAB_0012c343:
      Array<asl::Map<asl::String,_asl::String>::KeyVal>::~Array
                ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)&headers);
      String::~String(&line);
      String::~String(&res);
      String::~String(&method);
    }
  }
  String::~String(&head);
  return;
}

Assistant:

void WebSocketServer::serve(Socket client)
{
	String head = client.readLine();
	int i = head.indexOf(' ');
	if (i == -1)
		return;
	int j = head.indexOf(' ', i + 1);
	if (j == -1)
		return;
	String method = head.substring(0, i);
	String res = head.substring(i + 1, j);

	String line;
	Dic<String> headers;
	while (line = client.readLine(), line != "\r")
	{
		line = line.trim();
		int c = line.indexOf(':');
		if (c < 0) {
			client.close();
			return;
		}
		String name = line.substring(0, c);
		String cname;
		bool capitalize = true;
		for (int k = 0; k < name.length(); k++)
		{
			cname << char(capitalize ? toupper(name[k]) : tolower(name[k]));
			capitalize = !isalnum(name[k]);
		}

		String value = (c < line.length() - 1) ? line.substring(c + 2) : String();
		headers[cname] = value;
	}

	DEBUG_LOG("%s\n\n\n", *headers.join("\n", ": "));

	process(client, headers);
}